

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O3

void __thiscall ev3dev::sound_sensor::sound_sensor(sound_sensor *this,address_type *address)

{
  pointer pcVar1;
  pointer pcVar2;
  int iVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  lego_port port;
  allocator_type local_12a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_129;
  undefined1 local_128 [32];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  string local_e8;
  address_type local_c8;
  address_type local_a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  lego_port local_58;
  
  pcVar1 = (address->_M_dataplus)._M_p;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + address->_M_string_length);
  pcVar1 = local_128 + 0x10;
  local_128._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"lego-nxt-sound","");
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"nxt-analog","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_128;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_88,__l,&local_129,&local_12a);
  sensor::sensor(&this->super_sensor,&local_a8,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_88);
  lVar4 = 0;
  do {
    if (local_f8 + lVar4 != *(undefined1 **)((long)local_108 + lVar4)) {
      operator_delete(*(undefined1 **)((long)local_108 + lVar4));
    }
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((this->super_sensor).super_device._path._M_string_length == 0) {
    return;
  }
  sensor::driver_name_abi_cxx11_((string *)local_128,&this->super_sensor);
  iVar3 = std::__cxx11::string::compare(local_128);
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_);
  }
  if (iVar3 != 0) {
    return;
  }
  pcVar2 = (address->_M_dataplus)._M_p;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar2,pcVar2 + address->_M_string_length);
  lego_port::lego_port((lego_port *)local_128,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (local_128._8_8_ != 0) {
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"lego-nxt-sound","");
    lego_port::set_set_device(&local_58,(lego_port *)local_128,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.super_device._path._M_dataplus._M_p != &local_58.super_device._path.field_2) {
      operator_delete(local_58.super_device._path._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    lego_port::status_abi_cxx11_((string *)&local_88,(lego_port *)local_128);
    iVar3 = std::__cxx11::string::compare((char *)&local_88);
    if ((_Base_ptr *)local_88._M_impl._0_8_ !=
        &local_88._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_88._M_impl._0_8_);
    }
    if (iVar3 == 0) goto LAB_001192ab;
  }
  (this->super_sensor).super_device._path._M_string_length = 0;
  *(this->super_sensor).super_device._path._M_dataplus._M_p = '\0';
LAB_001192ab:
  if ((pointer)local_128._0_8_ != pcVar1) {
    operator_delete((void *)local_128._0_8_);
  }
  return;
}

Assistant:

sound_sensor::sound_sensor(address_type address)
    : sensor(address, { nxt_sound, nxt_analog })
{
    if (connected() && driver_name() == nxt_analog) {
        lego_port port(address);

        if (port.connected()) {
            port.set_set_device(nxt_sound);

            if (port.status() != nxt_sound) {
                // Failed to load lego-nxt-sound friver. Wrong port?
                _path.clear();
            }
        } else {
            _path.clear();
        }
    }
}